

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

string * __thiscall
helics::FederateState::processQueryActual_abi_cxx11_
          (string *__return_storage_ptr__,FederateState *this,string_view query)

{
  InterfaceInfo *this_00;
  value_t vVar1;
  uint uVar2;
  pointer ppVar3;
  TimeRepresentation<count_time<9,_long>_> TVar4;
  InputInfo *pIVar5;
  pointer pGVar6;
  json_value jVar7;
  TimeCoordinator *pTVar8;
  _Any_data *p_Var9;
  pointer pcVar10;
  pointer ppVar11;
  uint __val;
  size_type sVar12;
  size_t sVar13;
  char *pcVar14;
  undefined8 uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ostream *poVar19;
  string *psVar20;
  reference pvVar21;
  const_iterator cVar22;
  long lVar23;
  ulong uVar24;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tag;
  pointer ppVar25;
  FederateState *pFVar26;
  code *pcVar27;
  _Alloc_hider _Var28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_R9;
  uint __len;
  size_type __rlen;
  pointer ppVar29;
  undefined1 *puVar30;
  GlobalHandle *isrc;
  pointer pGVar31;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *ipt;
  pointer puVar32;
  _Any_data *p_Var33;
  char cVar34;
  bool bVar35;
  string_view request;
  string_view jsonString;
  anon_class_8_1_8991fb9c addHeader;
  json json;
  json base_1;
  string qres;
  json base;
  anon_class_8_1_8991fb9c local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string_view<char,_std::char_traits<char>_> local_378;
  data local_368;
  data local_358;
  data local_340;
  pthread_rwlock_t *local_330;
  data local_328;
  data local_318;
  string local_308;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [368];
  key_type local_168;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  data local_128;
  data local_118;
  pointer local_108;
  json_value jStack_100;
  __buckets_ptr local_f8;
  json_value jStack_f0;
  __node_base local_e8;
  json_value jStack_e0;
  undefined1 local_d8 [40];
  data local_b0;
  data local_a0;
  undefined1 local_90 [16];
  data local_80;
  data local_70;
  data local_60;
  data local_50;
  data local_40;
  
  local_378._M_str = query._M_str;
  local_378._M_len = query._M_len;
  this_00 = &this->interfaceInformation;
  local_2e8._8_8_ = (FederateState *)0x0;
  local_2d8._8_8_ =
       std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:2636:22)>
       ::_M_invoke;
  local_2d8._0_8_ =
       std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:2636:22)>
       ::_M_manager;
  request._M_str = (char *)this_00;
  request._M_len = (size_t)local_378._M_str;
  local_3c0.this = this;
  local_2e8._0_8_ = this;
  generateInterfaceQueryResults
            (&local_308,(helics *)local_378._M_len,request,(InterfaceInfo *)local_2e8,in_R9);
  if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
    (*(code *)local_2d8._0_8_)(local_2e8,local_2e8,3);
  }
  pcVar14 = local_378._M_str;
  sVar13 = local_378._M_len;
  if (local_308._M_string_length != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p == &local_308.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,local_308.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_308.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_308._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,local_308.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = local_308._M_string_length;
    local_308._M_string_length = 0;
    local_308.field_2._M_local_buf[0] = '\0';
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    goto LAB_00333c40;
  }
  puVar30 = &((FederateState *)(local_378._M_len + -0x570))->field_0x56c;
  switch(puVar30) {
  case (undefined1 *)0x0:
    goto switchD_0033246d_caseD_0;
  case (undefined1 *)0x2:
    goto switchD_0033246d_caseD_2;
  case (undefined1 *)0x4:
switchD_0033246d_caseD_4:
    iVar17 = bcmp(pcVar14,"barriers",sVar13);
    if (iVar17 == 0) {
      local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
      local_2e8._8_8_ = (FederateState *)0x0;
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&local_3c0,(json *)local_2e8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60,(initializer_list_t)ZEXT816(0),false,array);
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"barriers");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = local_60.m_type;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value = local_60.m_value;
      local_60.m_type = vVar1;
      local_60.m_value = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_60);
      pTVar8 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      ppVar29 = *(pointer *)
                 &(pTVar8->timeBlocks).
                  super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                  ._M_impl;
      ppVar3 = *(pointer *)
                ((long)&(pTVar8->timeBlocks).
                        super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
                + 8);
      if (ppVar29 != ppVar3) {
        do {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_3b8,(initializer_list_t)ZEXT816(0),false,object);
          local_358.m_type = null;
          local_358._1_7_ = 0;
          local_358.m_value.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_358,(long)ppVar29->second);
          pvVar21 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_3b8,"id");
          vVar1 = (pvVar21->m_data).m_type;
          (pvVar21->m_data).m_type = local_358.m_type;
          local_358.m_type = vVar1;
          jVar7 = (pvVar21->m_data).m_value;
          (pvVar21->m_data).m_value.object = (object_t *)local_358.m_value;
          local_358.m_value = jVar7;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_358);
          TVar4.internalTimeCode = (ppVar29->first).internalTimeCode;
          local_368.m_type = null;
          local_368._1_7_ = 0;
          local_368.m_value.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_368,
                     (double)(TVar4.internalTimeCode % 1000000000) * 1e-09 +
                     (double)(TVar4.internalTimeCode / 1000000000));
          pvVar21 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_3b8,"time");
          vVar1 = (pvVar21->m_data).m_type;
          (pvVar21->m_data).m_type = local_368.m_type;
          local_368.m_type = vVar1;
          jVar7 = (pvVar21->m_data).m_value;
          (pvVar21->m_data).m_value.object = (object_t *)local_368.m_value;
          local_368.m_value = jVar7;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_368);
          pvVar21 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_2e8,"barriers");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar21,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&local_3b8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_3b8);
          ppVar29 = ppVar29 + 1;
        } while (ppVar29 != ppVar3);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
      goto LAB_00333c33;
    }
    switch(puVar30) {
    case (undefined1 *)0x0:
      goto switchD_0033246d_caseD_0;
    case (undefined1 *)0x1:
    case (undefined1 *)0x3:
    case (undefined1 *)0x4:
    case (undefined1 *)0x5:
    case (undefined1 *)0x7:
      break;
    case (undefined1 *)0x2:
switchD_0033246d_caseD_2:
      iVar17 = bcmp(pcVar14,"config",sVar13);
      if (iVar17 == 0) {
        local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
        local_2e8._8_8_ = (FederateState *)0x0;
        TimeCoordinator::generateConfig
                  ((this->timeCoord)._M_t.
                   super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                   .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                   (json *)local_2e8);
        generateConfig(this,(json *)local_2e8);
        InterfaceInfo::generateInferfaceConfig(this_00,(json *)local_2e8);
        addFederateTags((json *)local_2e8,this);
        fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
        goto LAB_00333c33;
      }
      if ((FederateState *)sVar13 == (FederateState *)0x4) goto switchD_0033246d_caseD_0;
      goto LAB_00332a08;
    case (undefined1 *)0x6:
      goto switchD_0033246d_caseD_6;
    case (undefined1 *)0x8:
switchD_0033255f_caseD_8:
      iVar17 = bcmp(pcVar14,"global_state",sVar13);
      if (iVar17 == 0) {
        local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
        local_2e8._8_8_ = (FederateState *)0x0;
        processQueryActual::anon_class_8_1_8991fb9c::operator()(&local_3c0,(json *)local_2e8);
        psVar20 = fedStateString_abi_cxx11_((this->state)._M_i);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_70,psVar20);
        pvVar21 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_2e8,"state");
        vVar1 = (pvVar21->m_data).m_type;
        (pvVar21->m_data).m_type = local_70.m_type;
        jVar7 = (pvVar21->m_data).m_value;
        (pvVar21->m_data).m_value = local_70.m_value;
        local_70.m_type = vVar1;
        local_70.m_value = jVar7;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_70);
        fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
        goto LAB_00333c33;
      }
      if (9 < (long)sVar13) {
        if ((FederateState *)sVar13 == (FederateState *)0xa) goto switchD_0033246d_caseD_6;
        if ((FederateState *)sVar13 == (FederateState *)0x16) goto switchD_0033246d_caseD_12;
        if ((FederateState *)sVar13 == (FederateState *)0x15) goto switchD_0033246d_caseD_11;
        break;
      }
      if ((FederateState *)sVar13 == (FederateState *)0x4) goto switchD_0033246d_caseD_0;
LAB_00332a6c:
      if ((FederateState *)sVar13 == (FederateState *)0x6) goto switchD_0033246d_caseD_2;
      break;
    default:
switchD_0033255f_default:
      if ((FederateState *)sVar13 == (FederateState *)0x15) goto switchD_0033246d_caseD_11;
LAB_00332a08:
      if ((FederateState *)sVar13 != (FederateState *)0x16) break;
switchD_0033246d_caseD_12:
      iVar17 = bcmp(pcVar14,"unconnected_interfaces",sVar13);
      if (iVar17 != 0) {
        if ((FederateState *)sVar13 != (FederateState *)0x4) break;
switchD_0033246d_caseD_0:
        iVar17 = bcmp(pcVar14,"tags",sVar13);
        if (iVar17 != 0) break;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)local_2e8,(initializer_list_t)ZEXT816(0),false,object);
        ppVar25 = (this->tags).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar11 = (this->tags).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar25 != ppVar11) {
          do {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_328,&ppVar25->second);
            pcVar10 = (ppVar25->first)._M_dataplus._M_p;
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_168,pcVar10,pcVar10 + (ppVar25->first)._M_string_length);
            pvVar21 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)local_2e8,&local_168);
            vVar1 = (pvVar21->m_data).m_type;
            (pvVar21->m_data).m_type = local_328.m_type;
            jVar7 = (pvVar21->m_data).m_value;
            (pvVar21->m_data).m_value = local_328.m_value;
            local_328.m_type = vVar1;
            local_328.m_value = jVar7;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_328);
            ppVar25 = ppVar25 + 1;
          } while (ppVar25 != ppVar11);
        }
        fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
        goto LAB_00333c33;
      }
      local_398._M_dataplus._M_p = local_398._M_dataplus._M_p & 0xffffffffffffff00;
      local_398._M_string_length = 0;
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&local_3c0,(json *)&local_398);
      InterfaceInfo::getUnconnectedInterfaces(this_00,(json *)&local_398);
      if ((this->tags).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->tags).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)local_2e8,(initializer_list_t)ZEXT816(0),false,object);
        ppVar25 = (this->tags).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar11 = (this->tags).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar25 != ppVar11) {
          do {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_318,&ppVar25->second);
            pcVar10 = (ppVar25->first)._M_dataplus._M_p;
            local_148._0_8_ = local_148 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_148,pcVar10,pcVar10 + (ppVar25->first)._M_string_length);
            pvVar21 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)local_2e8,(key_type *)local_148);
            vVar1 = (pvVar21->m_data).m_type;
            (pvVar21->m_data).m_type = local_318.m_type;
            jVar7 = (pvVar21->m_data).m_value;
            (pvVar21->m_data).m_value = local_318.m_value;
            local_318.m_type = vVar1;
            local_318.m_value = jVar7;
            if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
              operator_delete((void *)local_148._0_8_,(ulong)(local_138._M_allocated_capacity + 1));
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_318);
            ppVar25 = ppVar25 + 1;
          } while (ppVar25 != ppVar11);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)local_90,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)local_2e8);
        pvVar21 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_398,"tags");
        vVar1 = (pvVar21->m_data).m_type;
        (pvVar21->m_data).m_type = local_90[0];
        jVar7 = (pvVar21->m_data).m_value;
        (pvVar21->m_data).m_value = (json_value)local_90._8_8_;
        local_90[0] = vVar1;
        local_90._8_8_ = jVar7;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_90);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_2e8);
      }
      p_Var33 = (_Any_data *)
                (this->queryCallbacks).
                super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var9 = (_Any_data *)
               (this->queryCallbacks).
               super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var33 != p_Var9) {
        do {
          if (*(long *)(p_Var33 + 1) == 0) {
            iVar17 = 0xb;
          }
          else {
            local_3b8._M_dataplus._M_p = (pointer)0x14;
            local_3b8._M_string_length = 0x43bdac;
            if (*(long *)(p_Var33 + 1) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)(p_Var33->_M_pod_data + 0x18))
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e8,p_Var33,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_3b8);
            if ((FederateState *)local_2e8._8_8_ == (FederateState *)0x0) {
LAB_00332f53:
              iVar17 = 0;
            }
            else {
              jsonString._M_str = (char *)local_2e8._8_8_;
              jsonString._M_len = (size_t)&local_3b8;
              fileops::loadJsonStr_abi_cxx11_(jsonString);
              iVar17 = 0;
              bVar35 = false;
              if ((char)local_3b8._M_dataplus._M_p == '\x01') {
                cVar22 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ::_M_find_tr<char[6],void>
                                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                     *)local_3b8._M_string_length,(char (*) [6])0x44c83c);
                bVar35 = cVar22._M_node != (_Base_ptr)(local_3b8._M_string_length + 8);
              }
              if (!bVar35) {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_340,
                             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_3b8);
                pvVar21 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)&local_398,"potential_interfaces");
                vVar1 = (pvVar21->m_data).m_type;
                (pvVar21->m_data).m_type = local_340.m_type;
                jVar7 = (pvVar21->m_data).m_value;
                (pvVar21->m_data).m_value = local_340.m_value;
                local_340.m_type = vVar1;
                local_340.m_value = jVar7;
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(&local_340);
                iVar17 = 10;
              }
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)&local_3b8);
              if (bVar35) goto LAB_00332f53;
            }
            if ((FederateState *)local_2e8._0_8_ != (FederateState *)local_2d8) {
              operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
            }
          }
        } while (((iVar17 == 0xb) || (iVar17 == 0)) && (p_Var33 = p_Var33 + 2, p_Var33 != p_Var9));
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_398,true);
      this_01 = &local_398;
      goto LAB_00333c3b;
    }
    break;
  case (undefined1 *)0x6:
switchD_0033246d_caseD_6:
    iVar17 = bcmp(pcVar14,"timeconfig",sVar13);
    if (iVar17 != 0) {
      if ((FederateState *)sVar13 != (FederateState *)0x4) {
        if ((FederateState *)sVar13 != (FederateState *)0x16) goto LAB_00332a6c;
        goto switchD_0033246d_caseD_12;
      }
      goto switchD_0033246d_caseD_0;
    }
    local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
    local_2e8._8_8_ = (FederateState *)0x0;
    TimeCoordinator::generateConfig
              ((this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
               (json *)local_2e8);
    generateConfig(this,(json *)local_2e8);
    fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
    goto LAB_00333c33;
  case (undefined1 *)0x8:
    iVar17 = bcmp(local_378._M_str,"global_flush",local_378._M_len);
    if (iVar17 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"{\"status\":true}","");
      goto LAB_00333c40;
    }
    switch(puVar30) {
    case (undefined1 *)0x0:
      goto switchD_0033246d_caseD_0;
    case (undefined1 *)0x2:
      goto switchD_0033246d_caseD_2;
    case (undefined1 *)0x4:
      goto switchD_0033246d_caseD_4;
    case (undefined1 *)0x6:
      goto switchD_0033246d_caseD_6;
    case (undefined1 *)0x8:
      goto switchD_0033252b_caseD_8;
    case (undefined1 *)0x9:
      goto switchD_0033246d_caseD_9;
    case (undefined1 *)0x11:
      goto switchD_0033246d_caseD_11;
    case (undefined1 *)0x12:
      goto switchD_0033246d_caseD_12;
    }
    break;
  case (undefined1 *)0x9:
switchD_0033246d_caseD_9:
    iVar17 = bcmp(pcVar14,"subscriptions",sVar13);
    if (iVar17 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,"[",1);
      local_330 = (pthread_rwlock_t *)&(this->interfaceInformation).inputs.m_mutex;
      std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_330->__data);
      puVar32 = (this->interfaceInformation).inputs.m_obj.dataStorage.
                super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_398.field_2._8_8_ =
           *(pointer *)
            ((long)&(this->interfaceInformation).inputs.m_obj.dataStorage.
                    super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
      if (puVar32 != (pointer)local_398.field_2._8_8_) {
        do {
          pIVar5 = (puVar32->_M_t).
                   super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                   .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl;
          pGVar6 = *(pointer *)
                    ((long)&(pIVar5->input_sources).
                            super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                    + 8);
          for (pGVar31 = *(pointer *)
                          &(pIVar5->input_sources).
                           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                           ._M_impl; pGVar31 != pGVar6; pGVar31 = pGVar31 + 1) {
            poVar19 = helics::operator<<((ostream *)local_2e8,
                                         (GlobalFederateId)(pGVar31->fed_id).gid);
            local_3b8._M_dataplus._M_p._0_1_ = 0x3a;
            poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar19,(char *)&local_3b8,1);
            poVar19 = helics::operator<<(poVar19,(InterfaceHandle)(pGVar31->handle).hid);
            local_3b8._M_dataplus._M_p._0_1_ = 0x3b;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)&local_3b8,1);
          }
          puVar32 = puVar32 + 1;
        } while (puVar32 != (pointer)local_398.field_2._8_8_);
      }
      pthread_rwlock_unlock(local_330);
      LOCK();
      (this->processing).super___atomic_flag_base._M_i = false;
      UNLOCK();
      std::__cxx11::stringbuf::str();
      if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
          == ';') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  (__return_storage_ptr__);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,']');
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
      std::ios_base::~ios_base((ios_base *)(local_2d8 + 0x60));
      goto LAB_00333c40;
    }
    switch(puVar30) {
    case (undefined1 *)0x0:
      goto switchD_0033246d_caseD_0;
    default:
      goto switchD_0033246d_caseD_1;
    case (undefined1 *)0x2:
      goto switchD_0033246d_caseD_2;
    case (undefined1 *)0x4:
      goto switchD_0033246d_caseD_4;
    case (undefined1 *)0x6:
      goto switchD_0033246d_caseD_6;
    case (undefined1 *)0x8:
switchD_0033252b_caseD_8:
      iVar17 = bcmp(pcVar14,"dependencies",sVar13);
      if (iVar17 != 0) {
        switch(puVar30) {
        case (undefined1 *)0x0:
          goto switchD_0033246d_caseD_0;
        case (undefined1 *)0x2:
          goto switchD_0033246d_caseD_2;
        case (undefined1 *)0x4:
          goto switchD_0033246d_caseD_4;
        case (undefined1 *)0x6:
          goto switchD_0033246d_caseD_6;
        case (undefined1 *)0x8:
          iVar17 = bcmp(pcVar14,"current_time",sVar13);
          if (iVar17 == 0) {
            (**(code **)((long)(((this->timeCoord)._M_t.
                                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>.
                                _M_head_impl)->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator
                        + 0x58))(__return_storage_ptr__);
            goto LAB_00333c40;
          }
          switch(puVar30) {
          case (undefined1 *)0x0:
            goto switchD_0033246d_caseD_0;
          default:
            break;
          case (undefined1 *)0x2:
            goto switchD_0033246d_caseD_2;
          case (undefined1 *)0x4:
            goto switchD_0033246d_caseD_4;
          case (undefined1 *)0x6:
            goto switchD_0033246d_caseD_6;
          case (undefined1 *)0x8:
            goto switchD_0033255f_caseD_8;
          case (undefined1 *)0x9:
            goto switchD_0033252b_caseD_9;
          case (undefined1 *)0x11:
            goto switchD_0033246d_caseD_11;
          case (undefined1 *)0x12:
            goto switchD_0033246d_caseD_12;
          }
        case (undefined1 *)0x9:
          goto switchD_0033252b_caseD_9;
        case (undefined1 *)0x11:
          goto switchD_0033246d_caseD_11;
        case (undefined1 *)0x12:
          goto switchD_0033246d_caseD_12;
        }
        goto switchD_0033246d_caseD_1;
      }
      TimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_398,
                 (this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
      sVar12 = local_398._M_string_length;
      local_398.field_2._8_8_ = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_398.field_2._8_8_;
      *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
      __return_storage_ptr__->_M_string_length = 1;
      if (local_398._M_dataplus._M_p != (pointer)local_398._M_string_length) {
        _Var28._M_p = local_398._M_dataplus._M_p;
        do {
          uVar2 = *(uint *)&(((FederateState *)_Var28._M_p)->name)._M_dataplus._M_p;
          __val = -uVar2;
          if (0 < (int)uVar2) {
            __val = uVar2;
          }
          __len = 1;
          if (9 < __val) {
            uVar24 = (ulong)__val;
            uVar16 = 4;
            do {
              __len = uVar16;
              uVar18 = (uint)uVar24;
              if (uVar18 < 100) {
                __len = __len - 2;
                goto LAB_0033387a;
              }
              if (uVar18 < 1000) {
                __len = __len - 1;
                goto LAB_0033387a;
              }
              if (uVar18 < 10000) goto LAB_0033387a;
              uVar24 = uVar24 / 10000;
              uVar16 = __len + 4;
            } while (99999 < uVar18);
            __len = __len + 1;
          }
LAB_0033387a:
          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_3b8,(ulong)(__len + -((int)uVar2 >> 0x1f)),'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3b8._M_dataplus._M_p + (uint)-((int)uVar2 >> 0x1f),__len,__val);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_40,&local_3b8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)local_2e8,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_40);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,(char *)local_2e8._0_8_,local_2e8._8_8_);
          if ((FederateState *)local_2e8._0_8_ != (FederateState *)local_2d8) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
            operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,',');
          _Var28._M_p = (pointer)((long)&(((FederateState *)_Var28._M_p)->name)._M_dataplus._M_p + 4
                                 );
        } while (_Var28._M_p != (pointer)sVar12);
      }
      if (__return_storage_ptr__->_M_string_length < 2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,']');
        _Var28._M_p = local_398._M_dataplus._M_p;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] =
             ']';
        _Var28._M_p = local_398._M_dataplus._M_p;
      }
      break;
    case (undefined1 *)0x9:
switchD_0033252b_caseD_9:
      iVar17 = bcmp(pcVar14,"current_state",sVar13);
      if (iVar17 != 0) {
        switch(puVar30) {
        case (undefined1 *)0x0:
          goto switchD_0033246d_caseD_0;
        case (undefined1 *)0x1:
        case (undefined1 *)0x3:
        case (undefined1 *)0x5:
        case (undefined1 *)0x7:
          goto switchD_0033246d_caseD_1;
        case (undefined1 *)0x2:
          goto switchD_0033246d_caseD_2;
        case (undefined1 *)0x4:
          goto switchD_0033246d_caseD_4;
        case (undefined1 *)0x6:
          goto switchD_0033246d_caseD_6;
        case (undefined1 *)0x8:
          goto switchD_0033255f_caseD_8;
        default:
          goto switchD_0033255f_default;
        }
      }
      local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
      local_2e8._8_8_ = (FederateState *)0x0;
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&local_3c0,(json *)local_2e8);
      psVar20 = fedStateString_abi_cxx11_((this->state)._M_i);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_50,psVar20);
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"state");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = local_50.m_type;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value = local_50.m_value;
      local_50.m_type = vVar1;
      local_50.m_value = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_50);
      iVar17 = publicationCount(this);
      local_d8._16_8_ = 0;
      local_d8._24_8_ = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)(local_d8 + 0x10),(long)iVar17);
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"publications");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = local_d8[0x10];
      local_d8[0x10] = vVar1;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value.object = (object_t *)local_d8._24_8_;
      local_d8._24_8_ = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)(local_d8 + 0x10));
      iVar17 = inputCount(this);
      local_d8._0_8_ = 0;
      local_d8._8_8_ = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)local_d8,(long)iVar17);
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"input");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = local_d8[0];
      local_d8[0] = vVar1;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value.object = (object_t *)local_d8._8_8_;
      local_d8._8_8_ = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)local_d8);
      iVar17 = endpointCount(this);
      local_e8._M_nxt = (_Hash_node_base *)0x0;
      jStack_e0.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_e8,(long)iVar17);
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"endpoints");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = (value_t)local_e8._M_nxt;
      local_e8._M_nxt._0_1_ = vVar1;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value.object = (object_t *)jStack_e0;
      jStack_e0 = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_e8);
      lVar23 = (this->time_granted).internalTimeCode;
      local_f8 = (__buckets_ptr)0x0;
      jStack_f0.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_f8,(double)(lVar23 % 1000000000) * 1e-09 + (double)(lVar23 / 1000000000))
      ;
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"granted_time");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = (value_t)local_f8;
      local_f8 = (__buckets_ptr)CONCAT71(local_f8._1_7_,vVar1);
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value.object = (object_t *)jStack_f0;
      jStack_f0 = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_f8);
      fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
      goto LAB_00333c33;
    case (undefined1 *)0x11:
      goto switchD_0033246d_caseD_11;
    case (undefined1 *)0x12:
      goto switchD_0033246d_caseD_12;
    }
    goto joined_r0x00333c99;
  case (undefined1 *)0x11:
switchD_0033246d_caseD_11:
    iVar17 = bcmp(pcVar14,"global_time_debugging",sVar13);
    if (iVar17 == 0) {
      local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
      local_2e8._8_8_ = (FederateState *)0x0;
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&local_3c0,(json *)local_2e8);
      psVar20 = fedStateString_abi_cxx11_((this->state)._M_i);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_80,psVar20);
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"federate_state");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = local_80.m_type;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value = local_80.m_value;
      local_80.m_type = vVar1;
      local_80.m_value = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_80);
      local_108 = (pointer)0x0;
      jStack_100.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_108,this->timeGranted_mode);
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"granted_mode");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = (value_t)local_108;
      local_108 = (pointer)CONCAT71(local_108._1_7_,vVar1);
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value.object = (object_t *)jStack_100;
      jStack_100 = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_108);
      pTVar8 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      if (*(pointer *)
           &(pTVar8->super_BaseTimeCoordinator).dependencies.dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> !=
          *(pointer *)((long)&(pTVar8->super_BaseTimeCoordinator).dependencies + 8)) {
        (**(code **)((long)(pTVar8->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x60))
                  (pTVar8,local_2e8);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
      goto LAB_00333c33;
    }
    if (((ulong)puVar30 >> 1 | (ulong)(((ulong)puVar30 & 1) != 0) << 0x3f) < 10) {
      psVar20 = (string *)
                (*(code *)(&DAT_00454200 + *(int *)(&DAT_00454200 + ((ulong)puVar30 >> 1) * 4)))();
      return psVar20;
    }
    break;
  case (undefined1 *)0x12:
    goto switchD_0033246d_caseD_12;
  }
switchD_0033246d_caseD_1:
  iVar17 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                     (&local_378,0,4,"tag/");
  pcVar14 = local_378._M_str;
  sVar13 = local_378._M_len;
  if (iVar17 == 0) {
    ppVar25 = (this->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar11 = (this->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar25 != ppVar11) {
      psVar20 = (string *)local_378._M_str;
      puVar30 = &((FederateState *)(local_378._M_len + -0x570))->field_0x56c;
      do {
        bVar35 = puVar30 == (undefined1 *)(ppVar25->first)._M_string_length;
        if (bVar35 && puVar30 != (undefined1 *)0x0) {
          iVar17 = bcmp((undefined1 *)((long)&(psVar20->_M_dataplus)._M_p + 4),
                        (ppVar25->first)._M_dataplus._M_p,(size_t)puVar30);
          bVar35 = iVar17 == 0;
        }
        if ((bVar35) && (generateJsonQuotedString(__return_storage_ptr__,&ppVar25->second), bVar35))
        goto LAB_00333c40;
        ppVar25 = ppVar25 + 1;
      } while (ppVar25 != ppVar11);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"\"","");
    goto LAB_00333c40;
  }
  switch(local_378._M_len) {
  case 4:
switchD_00332aff_caseD_4:
    iVar17 = bcmp(pcVar14,"logs",sVar13);
    if (iVar17 == 0) {
      local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
      local_2e8._8_8_ = (FederateState *)0x0;
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&local_3c0,(json *)local_2e8);
      bufferToJson(&((this->mLogManager)._M_t.
                     super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                     .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->mLogBuffer,
                   (json *)local_2e8);
      fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
      goto LAB_00333c33;
    }
    switch(sVar13) {
    case 0xb:
      goto switchD_00332aff_caseD_b;
    case 0xd:
      goto switchD_00332aff_caseD_d;
    case 0xf:
      goto switchD_00332aff_caseD_f;
    case 0x10:
      goto switchD_00332aff_caseD_10;
    }
    break;
  case 10:
    iVar17 = bcmp(local_378._M_str,"dependents",local_378._M_len);
    if (iVar17 != 0) {
      switch(sVar13) {
      case 0xb:
        goto switchD_00332aff_caseD_b;
      case 0xc:
      case 0xe:
        break;
      case 0xd:
        goto switchD_00332aff_caseD_d;
      case 0xf:
        goto switchD_00332aff_caseD_f;
      case 0x10:
        goto switchD_00332aff_caseD_10;
      default:
        if ((FederateState *)sVar13 == (FederateState *)0x4) goto switchD_00332aff_caseD_4;
      }
      break;
    }
    TimeCoordinator::getDependents
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               local_2e8,
               (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
    generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::FederateState::processQueryActual[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__2>
              (__return_storage_ptr__,local_2e8);
    _Var28._M_p = (pointer)local_2e8._0_8_;
    local_398.field_2._M_allocated_capacity = local_2d8._0_8_;
joined_r0x00333c99:
    if ((FederateState *)_Var28._M_p == (FederateState *)0x0) goto LAB_00333c40;
    pcVar27 = (code *)(local_398.field_2._M_allocated_capacity - (long)_Var28._M_p);
    goto LAB_00333369;
  case 0xb:
switchD_00332aff_caseD_b:
    iVar17 = bcmp(pcVar14,"global_time",sVar13);
    if (iVar17 == 0) goto LAB_00333373;
    if ((FederateState *)sVar13 == (FederateState *)&DAT_00000010) goto switchD_00332aff_caseD_10;
    if ((FederateState *)sVar13 == (FederateState *)0xd) goto switchD_00332aff_caseD_d;
    break;
  case 0xd:
switchD_00332aff_caseD_d:
    iVar17 = bcmp(pcVar14,"global_status",sVar13);
    if (iVar17 == 0) {
LAB_00333373:
      local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
      local_2e8._8_8_ = (FederateState *)0x0;
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&local_3c0,(json *)local_2e8);
      lVar23 = (((this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
               time_granted).internalTimeCode;
      local_118._0_8_ = (__node_base_ptr)0x0;
      local_118.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_118,(double)(lVar23 % 1000000000) * 1e-09 + (double)(lVar23 / 1000000000)
                );
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"granted_time");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = local_118.m_type;
      local_118.m_type = vVar1;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value.object = (object_t *)local_118.m_value;
      local_118.m_value = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_118);
      pTVar8 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      lVar23 = (pTVar8->info).outputDelay.internalTimeCode + (pTVar8->time_granted).internalTimeCode
      ;
      local_128._0_8_ = 0;
      local_128.m_value = (json_value)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_128,(double)(lVar23 % 1000000000) * 1e-09 + (double)(lVar23 / 1000000000)
                );
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)local_2e8,"send_time");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = local_128.m_type;
      local_128.m_type = vVar1;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value.object = (object_t *)local_128.m_value;
      local_128.m_value = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_128);
      fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
LAB_00333c33:
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8;
      goto LAB_00333c3b;
    }
    if ((FederateState *)sVar13 == (FederateState *)&DAT_00000010) goto switchD_00332aff_caseD_10;
    break;
  case 0xf:
switchD_00332aff_caseD_f:
    iVar17 = bcmp(pcVar14,"data_flow_graph",sVar13);
    if (iVar17 == 0) {
      local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
      local_2e8._8_8_ = (FederateState *)0x0;
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&local_3c0,(json *)local_2e8);
      InterfaceInfo::generateDataFlowGraph(this_00,(json *)local_2e8);
      fileops::generateJsonString(__return_storage_ptr__,(json *)local_2e8,true);
      goto LAB_00333c33;
    }
    if ((FederateState *)sVar13 == (FederateState *)&DAT_00000010) goto switchD_00332aff_caseD_10;
    if ((FederateState *)sVar13 == (FederateState *)0xd) goto switchD_00332aff_caseD_d;
    if ((FederateState *)sVar13 == (FederateState *)0xb) goto switchD_00332aff_caseD_b;
    break;
  case 0x10:
switchD_00332aff_caseD_10:
    iVar17 = bcmp(pcVar14,"dependency_graph",sVar13);
    if (iVar17 == 0) {
      local_3b8._M_dataplus._M_p = local_3b8._M_dataplus._M_p & 0xffffffffffffff00;
      local_3b8._M_string_length = 0;
      processQueryActual::anon_class_8_1_8991fb9c::operator()(&local_3c0,(json *)&local_3b8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_a0,(initializer_list_t)ZEXT816(0),false,array);
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_3b8,"dependents");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = local_a0.m_type;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value = local_a0.m_value;
      local_a0.m_type = vVar1;
      local_a0.m_value = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_a0);
      TimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 local_2e8,
                 (this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
      uVar15 = local_2e8._8_8_;
      if (local_2e8._0_8_ != local_2e8._8_8_) {
        pFVar26 = (FederateState *)local_2e8._0_8_;
        do {
          pvVar21 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_3b8,"dependents");
          local_398._M_dataplus._M_p = (pointer)0x0;
          local_398._M_string_length = 0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_398,(long)*(int *)&(pFVar26->name)._M_dataplus._M_p);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar21,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&local_398);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_398);
          pFVar26 = (FederateState *)((long)&(pFVar26->name)._M_dataplus._M_p + 4);
        } while (pFVar26 != (FederateState *)uVar15);
      }
      if ((FederateState *)local_2e8._0_8_ != (FederateState *)0x0) {
        operator_delete((void *)local_2e8._0_8_,local_2d8._0_8_ - local_2e8._0_8_);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_b0,(initializer_list_t)ZEXT816(0),false,array);
      pvVar21 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_3b8,"dependencies");
      vVar1 = (pvVar21->m_data).m_type;
      (pvVar21->m_data).m_type = local_b0.m_type;
      jVar7 = (pvVar21->m_data).m_value;
      (pvVar21->m_data).m_value = local_b0.m_value;
      local_b0.m_type = vVar1;
      local_b0.m_value = jVar7;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_b0);
      TimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 local_2e8,
                 (this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
      uVar15 = local_2e8._8_8_;
      if (local_2e8._0_8_ != local_2e8._8_8_) {
        pFVar26 = (FederateState *)local_2e8._0_8_;
        do {
          pvVar21 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_3b8,"dependencies");
          local_398._M_dataplus._M_p = (pointer)0x0;
          local_398._M_string_length = 0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_398,(long)*(int *)&(pFVar26->name)._M_dataplus._M_p);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar21,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&local_398);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_398);
          pFVar26 = (FederateState *)((long)&(pFVar26->name)._M_dataplus._M_p + 4);
        } while (pFVar26 != (FederateState *)uVar15);
      }
      if ((FederateState *)local_2e8._0_8_ != (FederateState *)0x0) {
        operator_delete((void *)local_2e8._0_8_,local_2d8._0_8_ - local_2e8._0_8_);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_3b8,true);
      this_01 = &local_3b8;
LAB_00333c3b:
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)this_01);
      goto LAB_00333c40;
    }
  }
  p_Var33 = (_Any_data *)
            (this->queryCallbacks).
            super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var9 = (_Any_data *)
           (this->queryCallbacks).
           super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var33 != p_Var9) {
    do {
      if (*(long *)(p_Var33 + 1) == 0) {
        cVar34 = '\x15';
      }
      else {
        local_2e8._0_8_ = local_378._M_len;
        local_2e8._8_8_ = local_378._M_str;
        (**(code **)(p_Var33->_M_pod_data + 0x18))
                  (__return_storage_ptr__,p_Var33,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_2e8);
        cVar34 = __return_storage_ptr__->_M_string_length != 0;
        if ((!(bool)cVar34) &&
           (pcVar10 = (__return_storage_ptr__->_M_dataplus)._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar10 != &__return_storage_ptr__->field_2)) {
          operator_delete(pcVar10,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
        }
      }
      if ((cVar34 != '\x15') && (cVar34 != '\0')) goto LAB_00333c40;
      p_Var33 = p_Var33 + 2;
    } while (p_Var33 != p_Var9);
  }
  ppVar25 = (this->tags).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar11 = (this->tags).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar25 != ppVar11) {
    psVar20 = &ppVar25->second;
    do {
      if ((FederateState *)local_378._M_len == (FederateState *)psVar20[-1]._M_string_length) {
        if ((FederateState *)local_378._M_len == (FederateState *)0x0) {
          bVar35 = true;
        }
        else {
          iVar17 = bcmp(local_378._M_str,psVar20[-1]._M_dataplus._M_p,local_378._M_len);
          bVar35 = iVar17 == 0;
        }
      }
      else {
        bVar35 = false;
      }
      if ((bVar35) && (generateJsonQuotedString(__return_storage_ptr__,psVar20), bVar35))
      goto LAB_00333c40;
      ppVar25 = (pointer)(psVar20 + 1);
      psVar20 = psVar20 + 2;
    } while (ppVar25 != ppVar11);
  }
  local_2e8._0_8_ = (FederateState *)local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,"unrecognized Federate query","");
  generateJsonErrorResponse(__return_storage_ptr__,BAD_REQUEST,(string *)local_2e8);
  if ((FederateState *)local_2e8._0_8_ != (FederateState *)local_2d8) {
    pcVar27 = (code *)(local_2d8._0_8_ + 1);
    _Var28._M_p = (pointer)local_2e8._0_8_;
LAB_00333369:
    operator_delete(_Var28._M_p,(ulong)pcVar27);
  }
LAB_00333c40:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,
                    CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                             local_308.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FederateState::processQueryActual(std::string_view query) const
{
    auto addHeader = [this](nlohmann::json& base) {
        nlohmann::json att = nlohmann::json::object();
        att["name"] = getIdentifier();
        att["id"] = global_id.load().baseValue();
        att["parent"] = mParent->getGlobalId().baseValue();
        base["attributes"] = att;
    };

    auto qres = generateInterfaceQueryResults(query, interfaceInformation, addHeader);
    if (!qres.empty()) {
        return qres;
    }
    if (query == "global_flush") {
        return "{\"status\":true}";
    }
    if (query == "subscriptions") {
        std::ostringstream subs;
        subs << "[";
        auto ipts = interfaceInformation.getInputs();
        for (const auto& ipt : ipts) {
            for (const auto& isrc : ipt->input_sources) {
                subs << isrc.fed_id << ':' << isrc.handle << ';';
            }
        }
        ipts.unlock();
        unlock();
        auto str = subs.str();
        if (str.back() == ';') {
            str.pop_back();
        }
        str.push_back(']');
        return str;
    }
    if (query == "dependencies") {
        return generateStringVector(timeCoord->getDependencies(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (query == "current_time") {
        return timeCoord->printTimeStatus();
    }
    if (query == "current_state") {
        nlohmann::json base;
        addHeader(base);
        base["state"] = fedStateString(state.load());
        base["publications"] = publicationCount();
        base["input"] = inputCount();
        base["endpoints"] = endpointCount();
        base["granted_time"] = static_cast<double>(grantedTime());
        return fileops::generateJsonString(base);
    }
    if (query == "barriers") {
        nlohmann::json base;
        addHeader(base);

        base["barriers"] = nlohmann::json::array();
        for (const auto& barrier : timeCoord->getBarriers()) {
            nlohmann::json br1 = nlohmann::json::object();
            br1["id"] = barrier.second;
            br1["time"] = static_cast<double>(barrier.first);
            base["barriers"].push_back(std::move(br1));
        }
        return fileops::generateJsonString(base);
    }
    if (query == "global_state") {
        nlohmann::json base;
        addHeader(base);
        base["state"] = fedStateString(state.load());
        return fileops::generateJsonString(base);
    }
    if (query == "global_time_debugging") {
        nlohmann::json base;
        addHeader(base);
        base["federate_state"] = fedStateString(state.load());
        base["granted_mode"] = timeGranted_mode;
        if (!timeCoord->empty()) {
            timeCoord->generateDebuggingTimeInfo(base);
        }
        return fileops::generateJsonString(base);
    }
    if (query == "timeconfig") {
        nlohmann::json base;
        timeCoord->generateConfig(base);
        generateConfig(base);
        return fileops::generateJsonString(base);
    }
    if (query == "config") {
        nlohmann::json base;
        timeCoord->generateConfig(base);
        generateConfig(base);
        interfaceInformation.generateInferfaceConfig(base);
        addFederateTags(base, this);
        return fileops::generateJsonString(base);
    }
    if (query == "unconnected_interfaces") {
        nlohmann::json base;
        addHeader(base);
        interfaceInformation.getUnconnectedInterfaces(base);

        if (!tags.empty()) {
            nlohmann::json tagBlock = nlohmann::json::object();
            for (const auto& tag : tags) {
                tagBlock[tag.first] = tag.second;
            }
            base["tags"] = tagBlock;
        }
        if (!queryCallbacks.empty()) {
            for (const auto& queryCallback : queryCallbacks) {
                if (!queryCallback) {
                    continue;
                }
                auto potential = queryCallback("potential_interfaces");
                if (!potential.empty()) {
                    try {
                        auto json = fileops::loadJsonStr(potential);

                        if (!json.contains("error")) {
                            base["potential_interfaces"] = json;
                            break;
                        }
                    }
                    catch (const std::invalid_argument&) {
                        ;
                    }
                }
            }
        }
        return fileops::generateJsonString(base);
    }
    if (query == "tags") {
        nlohmann::json tagBlock = nlohmann::json::object();
        for (const auto& tag : tags) {
            tagBlock[tag.first] = tag.second;
        }
        return fileops::generateJsonString(tagBlock);
    }
    if (query.compare(0, 4, "tag/") == 0) {
        std::string_view keyTag = query;
        keyTag.remove_prefix(4);
        for (const auto& tag : tags) {
            if (keyTag == tag.first) {
                return generateJsonQuotedString(tag.second);
            }
        }
        return "\"\"";
    }
    if (query == "dependents") {
        return generateStringVector(timeCoord->getDependents(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (query == "logs") {
        nlohmann::json base;
        addHeader(base);
        bufferToJson(mLogManager->getLogBuffer(), base);
        return fileops::generateJsonString(base);
    }
    if (query == "data_flow_graph") {
        nlohmann::json base;
        addHeader(base);
        interfaceInformation.generateDataFlowGraph(base);
        return fileops::generateJsonString(base);
    }
    if (query == "global_time" || query == "global_status") {
        nlohmann::json base;
        addHeader(base);
        base["granted_time"] = static_cast<double>(timeCoord->getGrantedTime());
        base["send_time"] = static_cast<double>(timeCoord->allowedSendTime());
        return fileops::generateJsonString(base);
    }
    if (query == "dependency_graph") {
        nlohmann::json base;
        addHeader(base);
        base["dependents"] = nlohmann::json::array();
        for (auto& dep : timeCoord->getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (auto& dep : timeCoord->getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }

    if (!queryCallbacks.empty()) {
        for (const auto& queryCallback : queryCallbacks) {
            if (!queryCallback) {
                continue;
            }
            auto val = queryCallback(query);
            if (!val.empty()) {
                return val;
            }
        }
    }
    // check existingTag value for a matching string
    for (const auto& tag : tags) {
        if (tag.first == query) {
            return generateJsonQuotedString(tag.second);
        }
    }
    return generateJsonErrorResponse(JsonErrorCodes::BAD_REQUEST, "unrecognized Federate query");
}